

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_writer.h
# Opt level: O0

void __thiscall
cppwinrt::writer_base<cppwinrt::writer>::
write_segment<std::__cxx11::string,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
          (writer_base<cppwinrt::writer> *this,string_view *value,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *first,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rest,
          basic_string_view<char,_std::char_traits<char>_> *rest_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rest_2,
          basic_string_view<char,_std::char_traits<char>_> *rest_3,
          basic_string_view<char,_std::char_traits<char>_> *rest_4)

{
  size_type sVar1;
  const_reference pvVar2;
  size_type sVar3;
  size_t __n;
  void *__buf;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  string_view local_80;
  undefined1 local_70 [16];
  basic_string_view<char,_std::char_traits<char>_> local_60;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  size_type local_40;
  size_type offset;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rest_local_2;
  basic_string_view<char,_std::char_traits<char>_> *rest_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rest_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *first_local;
  string_view *value_local;
  writer_base<cppwinrt::writer> *this_local;
  
  offset = (size_type)rest_2;
  rest_local_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)rest_1;
  rest_local_1 = (basic_string_view<char,_std::char_traits<char>_> *)rest;
  rest_local = first;
  first_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)value;
  value_local = (string_view *)this;
  local_40 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of(value,"^%@",0);
  if (local_40 == 0xffffffffffffffff) {
    __assert_fail("offset != std::string_view::npos",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/oldnewthing[P]cppwinrt/cppwinrt/text_writer.h"
                  ,0x125,
                  "void cppwinrt::writer_base<cppwinrt::writer>::write_segment(const std::string_view &, const First &, const Rest &...) [T = cppwinrt::writer, First = std::basic_string<char>, Rest = <std::basic_string<char>, std::basic_string_view<char>, std::basic_string<char>, std::basic_string_view<char>, std::basic_string_view<char>>]"
                 );
  }
  local_50 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                       ((basic_string_view<char,_std::char_traits<char>_> *)first_local,0,local_40);
  write(this,(int)&local_50,local_50._M_str,(size_t)rest);
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                     ((basic_string_view<char,_std::char_traits<char>_> *)first_local,local_40);
  sVar1 = local_40;
  if (*pvVar2 == '^') {
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)first_local);
    __n = sVar3 - 1;
    if (sVar1 == __n) {
      __assert_fail("offset != value.size() - 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/oldnewthing[P]cppwinrt/cppwinrt/text_writer.h"
                    ,0x12a,
                    "void cppwinrt::writer_base<cppwinrt::writer>::write_segment(const std::string_view &, const First &, const Rest &...) [T = cppwinrt::writer, First = std::basic_string<char>, Rest = <std::basic_string<char>, std::basic_string_view<char>, std::basic_string<char>, std::basic_string_view<char>, std::basic_string_view<char>>]"
                   );
    }
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       ((basic_string_view<char,_std::char_traits<char>_> *)first_local,local_40 + 1
                       );
    write(this,(int)*pvVar2,__buf,__n);
    local_60 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         ((basic_string_view<char,_std::char_traits<char>_> *)first_local,
                          local_40 + 2,0xffffffffffffffff);
    write_segment<std::__cxx11::string,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
              (this,&local_60,rest_local,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)rest_local_1,
               (basic_string_view<char,_std::char_traits<char>_> *)rest_local_2,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)offset,rest_3,
               rest_4);
  }
  else {
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       ((basic_string_view<char,_std::char_traits<char>_> *)first_local,local_40);
    if (*pvVar2 == '%') {
      local_70 = ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)rest_local);
      write(this,(int)local_70,local_70._8_8_,(size_t)rest);
    }
    else {
      local_80 = (string_view)
                 ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)rest_local);
      cppwinrt::writer::write_code((writer *)this,&local_80);
    }
    local_90 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         ((basic_string_view<char,_std::char_traits<char>_> *)first_local,
                          local_40 + 1,0xffffffffffffffff);
    write_segment<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
              (this,&local_90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)rest_local_1,
               (basic_string_view<char,_std::char_traits<char>_> *)rest_local_2,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)offset,rest_3,
               rest_4);
  }
  return;
}

Assistant:

void write_segment(std::string_view const& value, First const& first, Rest const&... rest)
        {
            auto offset = value.find_first_of("^%@");
            assert(offset != std::string_view::npos);
            write(value.substr(0, offset));

            if (value[offset] == '^')
            {
                assert(offset != value.size() - 1);

                write(value[offset + 1]);
                write_segment(value.substr(offset + 2), first, rest...);
            }
            else
            {
                if (value[offset] == '%')
                {
                    static_cast<T*>(this)->write(first);
                }
                else
                {
                    if constexpr (std::is_convertible_v<First, std::string_view>)
                    {
                        static_cast<T*>(this)->write_code(first);
                    }
                    else
                    {
                        assert(false); // '@' placeholders are only for text.
                    }
                }

                write_segment(value.substr(offset + 1), rest...);
            }
        }